

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Trainer::Node::updateStrategy(Node *this)

{
  byte bVar1;
  double *pdVar2;
  double *pdVar3;
  int a_1;
  int a;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  if (this->mNeedToUpdateStrategy == true) {
    bVar1 = this->mActionNum;
    pdVar2 = this->mRegretSum;
    pdVar3 = this->mStrategy;
    dVar5 = 0.0;
    for (uVar4 = 0; bVar1 != uVar4; uVar4 = uVar4 + 1) {
      dVar6 = pdVar2[uVar4];
      if (dVar6 <= 0.0) {
        dVar6 = 0.0;
      }
      pdVar3[uVar4] = dVar6;
      dVar5 = dVar5 + dVar6;
    }
    pdVar2 = this->mStrategy;
    for (uVar4 = 0; bVar1 != uVar4; uVar4 = uVar4 + 1) {
      dVar6 = 1.0 / (double)bVar1;
      if (0.0 < dVar5) {
        dVar6 = pdVar2[uVar4] / dVar5;
      }
      pdVar2[uVar4] = dVar6;
    }
  }
  return;
}

Assistant:

void Node::updateStrategy() {
    if (!mNeedToUpdateStrategy) {
        return;
    }
    double normalizingSum = 0.0;
    for (int a = 0; a < mActionNum; ++a) {
        mStrategy[a] = mRegretSum[a] > 0 ? mRegretSum[a] : 0;
        normalizingSum += mStrategy[a];
    }
    for (int a = 0; a < mActionNum; ++a) {
        if (normalizingSum > 0) {
            mStrategy[a] /= normalizingSum;
        } else {
            mStrategy[a] = 1.0 / (double) mActionNum;
        }
    }
}